

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O3

UChar32 ucase_tolower_63(UChar32 c)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  uint uVar4;
  ushort *puVar5;
  uint uVar6;
  ulong uVar7;
  
  if ((uint)c < 0xd800) {
    uVar4 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar4 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar4 = (uint)c >> 5;
    }
  }
  else {
    uVar3 = 0xd30;
    if ((0x10ffff < (uint)c) || (uVar3 = 0x2f1c, 0xe07ff < (uint)c)) goto LAB_0032b2bc;
    uVar4 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar3 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar4] * 4);
LAB_0032b2bc:
  uVar1 = ucase_props_trieIndex[uVar3];
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 2) != 0) {
      return c + ((int)(short)uVar1 >> 7);
    }
  }
  else {
    uVar3 = (ulong)(uVar1 >> 4);
    puVar5 = ucase_props_exceptions + uVar3 + 1;
    uVar2 = ucase_props_exceptions[uVar3];
    if (((uVar1 & 2) == 0) || ((uVar2 & 0x10) == 0)) {
      if ((uVar2 & 1) != 0) {
        if ((uVar2 >> 8 & 1) == 0) {
          return (UChar32)*puVar5;
        }
        return CONCAT22(ucase_props_exceptions[uVar3 + 1],ucase_props_exceptions[uVar3 + 2]);
      }
    }
    else {
      uVar7 = (ulong)""[uVar2 & 0xf];
      if ((uVar2 >> 8 & 1) == 0) {
        uVar4 = (uint)puVar5[uVar7];
      }
      else {
        uVar4 = CONCAT22(puVar5[uVar7 * 2],*(undefined2 *)(uVar3 * 2 + 0x3bd534 + uVar7 * 4));
      }
      uVar6 = -uVar4;
      if ((uVar2 >> 10 & 1) == 0) {
        uVar6 = uVar4;
      }
      c = c + uVar6;
    }
  }
  return c;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucase_tolower(UChar32 c) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_IS_UPPER_OR_TITLE(props)) {
            c+=UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        uint16_t excWord=*pe++;
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_IS_UPPER_OR_TITLE(props)) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_LOWER, pe, c);
        }
    }
    return c;
}